

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeHolder::growBuffer(CodeHolder *this,CodeBuffer *cb,size_t n)

{
  CodeBuffer *n_00;
  CodeBuffer *pCVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t old;
  size_t required;
  size_t capacity;
  size_t length;
  CodeBuffer *pCVar2;
  Error local_30;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x20) + 0x80))();
  }
  if (-(long)*(CodeHolder **)(in_RSI + 8) - 1U < in_RDX) {
    local_30 = 1;
  }
  else {
    pCVar2 = *(CodeBuffer **)(in_RSI + 0x10);
    n_00 = (CodeBuffer *)(*(long *)(in_RSI + 8) + in_RDX);
    if (pCVar2 < n_00) {
      if ((*(byte *)(in_RSI + 0x19) & 1) == 0) {
        if (pCVar2 < (CodeBuffer *)0x1fa0) {
          pCVar2 = (CodeBuffer *)0x1fa0;
        }
        else {
          pCVar2 = pCVar2 + 1;
        }
        do {
          if (pCVar2 < (CodeBuffer *)0x800000) {
            pCVar1 = (CodeBuffer *)((long)pCVar2 << 1);
          }
          else {
            pCVar1 = pCVar2 + 0x40000;
          }
          if (pCVar1 < (CodeBuffer *)0x800000) {
            pCVar1 = (CodeBuffer *)((long)pCVar1 << 1);
          }
          else {
            pCVar1 = pCVar1 + 0x40000;
          }
          if (pCVar1 < pCVar2) {
            return 1;
          }
          pCVar2 = pCVar1;
        } while (pCVar1 + -1 < n_00);
        local_30 = CodeHolder_reserveInternal(*(CodeHolder **)(in_RSI + 8),pCVar1,(size_t)n_00);
      }
      else {
        local_30 = 0xb;
      }
    }
    else {
      local_30 = 0;
    }
  }
  return local_30;
}

Assistant:

Error CodeHolder::growBuffer(CodeBuffer* cb, size_t n) noexcept {
  // This is most likely called by `Assembler` so `sync()` shouldn't be needed,
  // however, if this is called by the user and the currently attached Assembler
  // did generate some code we could lose that, so sync now and make sure the
  // section length is updated.
  if (_cgAsm) _cgAsm->sync();

  // Now the length of the section must be valid.
  size_t length = cb->getLength();
  if (ASMJIT_UNLIKELY(n > IntTraits<uintptr_t>::maxValue() - length))
    return DebugUtils::errored(kErrorNoHeapMemory);

  // We can now check if growing the buffer is really necessary. It's unlikely
  // that this function is called while there is still room for `n` bytes.
  size_t capacity = cb->getCapacity();
  size_t required = cb->getLength() + n;
  if (ASMJIT_UNLIKELY(required <= capacity)) return kErrorOk;

  if (cb->isFixedSize())
    return DebugUtils::errored(kErrorCodeTooLarge);

  if (capacity < 8096)
    capacity = 8096;
  else
    capacity += Globals::kAllocOverhead;

  do {
    size_t old = capacity;
    if (capacity < Globals::kAllocThreshold)
      capacity *= 2;
    else
      capacity += Globals::kAllocThreshold;

    if (capacity < Globals::kAllocThreshold)
      capacity *= 2;
    else
      capacity += Globals::kAllocThreshold;

    // Overflow.
    if (ASMJIT_UNLIKELY(old > capacity))
      return DebugUtils::errored(kErrorNoHeapMemory);
  } while (capacity - Globals::kAllocOverhead < required);

  return CodeHolder_reserveInternal(this, cb, capacity - Globals::kAllocOverhead);
}